

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O3

void __thiscall
HACD::RaycastMesh::Initialize
          (RaycastMesh *this,size_t nVertices,size_t nTriangles,Vec3<double> *vertices,
          Vec3<long> *triangles,size_t maxDepth,size_t minLeafSize,Float minAxisSize)

{
  undefined8 *puVar1;
  RMNode *pRVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  ulong *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  ulong local_38;
  
  auVar10 = in_ZMM1._0_16_;
  this->m_triangles = triangles;
  this->m_vertices = vertices;
  this->m_nVertices = nVertices;
  this->m_nTriangles = nTriangles;
  pRVar2 = this->m_nodes;
  if (pRVar2 != (RMNode *)0x0) {
    lVar6 = *(long *)&pRVar2[-1].m_leaf;
    if (lVar6 != 0) {
      lVar7 = lVar6 * 0xf0;
      do {
        pvVar3 = *(void **)((long)(pRVar2->m_bBox).m_min.m_data + lVar7 + -0x40);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        auVar10 = in_ZMM1._0_16_;
        lVar7 = lVar7 + -0xf0;
      } while (lVar7 != 0);
    }
    operator_delete__(&pRVar2[-1].m_leaf,lVar6 * 0xf0 | 8);
  }
  this->m_nNodes = 0;
  uVar9 = maxDepth << (maxDepth & 0x3f);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  this->m_nMaxNodes = uVar9;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xf0),8) == 0) {
    uVar8 = SUB168(auVar4 * ZEXT816(0xf0),0) | 8;
  }
  puVar5 = (ulong *)operator_new__(uVar8);
  *puVar5 = uVar9;
  if (uVar9 != 0) {
    auVar10 = vpcmpeqd_avx(auVar10,auVar10);
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)puVar5 + lVar6 + 0xd0);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar5 + lVar6 + 0xe0) = 0x10;
      *(undefined1 (*) [16])((long)puVar5 + lVar6 + 8) = auVar10;
      *(undefined8 *)((long)puVar5 + lVar6 + 0x18) = 0xffffffffffffffff;
      *(undefined8 *)((long)puVar5 + lVar6 + 0xe8) = 0;
      *(undefined1 *)((long)puVar5 + lVar6 + 0xf0) = 0;
      lVar6 = lVar6 + 0xf0;
    } while (uVar9 * 0xf0 - lVar6 != 0);
  }
  this->m_nodes = (RMNode *)(puVar5 + 1);
  this->m_nNodes = 1;
  SArray<long,_16UL>::Resize((SArray<long,_16UL> *)(puVar5 + 10),nTriangles);
  if (this->m_nTriangles != 0) {
    uVar8 = 0;
    do {
      local_38 = uVar8;
      SArray<long,_16UL>::PushBack((SArray<long,_16UL> *)(puVar5 + 10),(long *)&local_38);
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->m_nTriangles);
  }
  puVar5[0x1d] = (ulong)this;
  puVar5[1] = 0;
  RMNode::Create((RMNode *)(puVar5 + 1),0,maxDepth,minLeafSize,minAxisSize);
  return;
}

Assistant:

void RaycastMesh::Initialize(size_t nVertices, size_t nTriangles, 
								Vec3<Float> *  vertices,  Vec3<long> * triangles, 
								size_t maxDepth, size_t minLeafSize, Float minAxisSize)
	{
		m_triangles  = triangles;			
		m_vertices   = vertices;		
		m_nVertices  = nVertices;
		m_nTriangles = nTriangles;
		delete [] m_nodes;
		m_nNodes = 0;
		m_nMaxNodes = 0;
		for(size_t k = 0; k < maxDepth; k++)
		{
			m_nMaxNodes += ((size_t)1 << maxDepth);
		}
		m_nodes = new RMNode[m_nMaxNodes];
		RMNode & root = m_nodes[AddNode()];
		root.m_triIDs.Resize(nTriangles);
		for(size_t t = 0; t < m_nTriangles; ++t) root.m_triIDs.PushBack((long)t);
		root.m_rm = this;
		root.m_id = 0;
		root.Create(0, maxDepth, minLeafSize, minAxisSize);
	}